

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relivedb.cpp
# Opt level: O1

unique_ptr<relive::Track,_std::default_delete<relive::Track>_> __thiscall
relive::ReLiveDB::fetchTrack(ReLiveDB *this,int64_t trackId)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(trackId + 0x1d8));
  if (iVar1 == 0) {
    storage_abi_cxx11_();
    sqlite_orm::internal::storage_t<$86c824a$>::get_pointer<relive::Track,_long>
              ((storage_t<_86c824a_> *)this,0x21ce70);
    pthread_mutex_unlock((pthread_mutex_t *)(trackId + 0x1d8));
    return (__uniq_ptr_data<relive::Track,_std::default_delete<relive::Track>,_true,_true>)
           (__uniq_ptr_data<relive::Track,_std::default_delete<relive::Track>,_true,_true>)this;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

std::unique_ptr<Track> ReLiveDB::fetchTrack(int64_t trackId)
{
    std::lock_guard<Mutex> lock{_mutex};
    return storage().get_pointer<Track>(trackId);
}